

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-sched.cpp
# Opt level: O2

bool gpt2_eval(gpt2_model *model,ggml_backend_sched_t sched,int n_past,
              vector<int,_std::allocator<int>_> *embd_inp,
              vector<float,_std::allocator<float>_> *embd_w)

{
  pointer piVar1;
  pointer piVar2;
  ggml_cgraph *pgVar3;
  undefined8 uVar4;
  size_type __new_size;
  
  piVar1 = (embd_inp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  piVar2 = (embd_inp->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  __new_size = (size_type)(model->hparams).n_vocab;
  pgVar3 = gpt2_graph(model,n_past,embd_inp);
  ggml_backend_sched_reset(sched);
  ggml_backend_sched_graph_compute(sched,pgVar3);
  uVar4 = ggml_graph_node(pgVar3,0xffffffffffffffff);
  std::vector<float,_std::allocator<float>_>::resize(embd_w,__new_size);
  ggml_backend_tensor_get
            (uVar4,(embd_w->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start,
             ((long)(int)((ulong)((long)piVar1 - (long)piVar2) >> 2) + -1) * __new_size * 4,
             __new_size << 2);
  return true;
}

Assistant:

bool gpt2_eval(
        const gpt2_model & model,
        ggml_backend_sched_t sched,
        const int n_past,
        const std::vector<gpt_vocab::id> & embd_inp,
              std::vector<float>         & embd_w) {
    const int N = embd_inp.size();

    const auto & hparams = model.hparams;

    const int n_vocab = hparams.n_vocab;

    struct ggml_cgraph * gf = gpt2_graph(model, n_past, embd_inp);

    // run the computation
    ggml_backend_sched_reset(sched);
    ggml_backend_sched_graph_compute(sched, gf);

    //if (n_past%100 == 0) {
    //    ggml_graph_print   (&gf);
    //    ggml_graph_dump_dot(&gf, NULL, "gpt-2.dot");
    //}

    // in this case, the output tensor is the last one in the graph
    struct ggml_tensor * inpL = ggml_graph_node(gf, -1);

    //embd_w.resize(n_vocab*N);
    //ggml_backend_tensor_get(inpL, embd_w.data(), 0, sizeof(float)*n_vocab*N);

    // return result just for the last token
    embd_w.resize(n_vocab);
    ggml_backend_tensor_get(inpL, embd_w.data(), (n_vocab*(N-1))*sizeof(float), sizeof(float)*n_vocab);

    return true;
}